

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
StringToBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *str)

{
  string s;
  allocator_type local_31;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  long local_28;
  
  std::__cxx11::string::string((string *)&local_30,str);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,local_30,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_30._M_current + local_28),&local_31);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringToBytes(const std::string& str) {
    
    std::string s(str);
    return std::vector<uint8_t> (s.begin(), s.end());
}